

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFFormFieldObjectHelper::generateTextAppearance
          (QPDFFormFieldObjectHelper *this,QPDFAnnotationObjectHelper *aoh)

{
  bool bVar1;
  uint uVar2;
  string *data;
  ulong uVar3;
  QPDFObjectHandle *oh;
  size_type sVar4;
  reference pvVar5;
  ValueSetter *this_00;
  bool local_80a;
  shared_ptr<QPDFObjectHandle::TokenFilter> local_6e0;
  string local_6d0 [32];
  ulong local_6b0;
  size_t i;
  allocator<char> local_681;
  string local_680 [32];
  QPDFObjectHandle local_660;
  undefined1 local_650 [8];
  string encoding;
  string local_628 [32];
  QPDFObjectHandle local_608;
  allocator<char> local_5f1;
  string local_5f0 [32];
  QPDFObjectHandle local_5d0;
  QPDFObjectHandle local_5c0;
  allocator<char> local_5a9;
  string local_5a8;
  QPDFObjectHandle local_588;
  QPDFObjectHandle local_578;
  allocator<char> local_561;
  string local_560;
  QPDFObjectHandle local_540;
  undefined1 local_530 [32];
  undefined1 local_510 [8];
  QPDFObjectHandle dr;
  bool found_font_in_dr;
  undefined1 local_4e8 [8];
  QPDFObjectHandle font;
  string local_4d0 [32];
  undefined1 local_4b0 [24];
  QPDFObjectHandle resources;
  string font_name;
  _func_string_string_ptr_char *encoder;
  double local_448;
  double tf;
  Pl_QPDFTokenizer tok;
  TfFinder tff;
  undefined1 local_368 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opt;
  string V;
  string DA;
  Rectangle bbox;
  string local_2e8;
  undefined1 local_2c8 [24];
  string local_2b0 [32];
  undefined1 local_290 [24];
  QPDFObjectHandle bbox_obj;
  string local_268;
  undefined1 local_248 [24];
  string local_230;
  undefined1 local_210 [40];
  string local_1e8;
  undefined1 local_1c8 [24];
  QPDFObjectHandle AP;
  string local_1a0 [32];
  undefined1 local_180 [55];
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  QPDFObjectHandle dict;
  Rectangle bbox_1;
  Rectangle rect;
  string local_80 [55];
  allocator<char> local_49;
  string local_48;
  QPDFObjectHandle AS;
  QPDFAnnotationObjectHelper *aoh_local;
  QPDFFormFieldObjectHelper *this_local;
  
  AS.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aoh;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"/N",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_80,"",(allocator<char> *)((long)&rect.ury + 7));
  QPDFAnnotationObjectHelper::getAppearanceStream
            ((QPDFAnnotationObjectHelper *)&stack0xffffffffffffffd8,(string *)aoh,&local_48);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&rect.ury + 7));
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)&stack0xffffffffffffffd8);
  if (bVar1) {
    QTC::TC("qpdf","QPDFFormFieldObjectHelper create AS from scratch",0);
    QPDFAnnotationObjectHelper::getRect
              ((Rectangle *)&bbox_1.ury,
               (QPDFAnnotationObjectHelper *)
               AS.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    QPDFObjectHandle::Rectangle::Rectangle
              ((Rectangle *)
               &dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,0.0,0.0,rect.lly - bbox_1.ury,rect.urx - rect.llx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,
               "<< /Resources << /ProcSet [ /PDF /Text ] >> /Type /XObject /Subtype /Form >>",
               &local_f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"",&local_121);
    QPDFObjectHandle::parse((QPDFObjectHandle *)local_d8,&local_f8,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"/BBox",&local_149);
    QPDFObjectHandle::newFromRectangle
              ((QPDFObjectHandle *)(local_180 + 0x20),
               (Rectangle *)
               &dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    QPDFObjectHandle::replaceKey
              ((QPDFObjectHandle *)local_d8,&local_148,(QPDFObjectHandle *)(local_180 + 0x20));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_180 + 0x20));
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator(&local_149);
    QPDFObjectHelper::oh((QPDFObjectHelper *)local_180);
    data = (string *)QPDFObjectHandle::getOwningQPDF((QPDFObjectHandle *)local_180);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_1a0,"/Tx BMC\nEMC\n",
               (allocator<char> *)
               ((long)&AP.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFObjectHandle::newStream((QPDF *)(local_180 + 0x10),data);
    QPDFObjectHandle::operator=
              ((QPDFObjectHandle *)&stack0xffffffffffffffd8,(QPDFObjectHandle *)(local_180 + 0x10));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_180 + 0x10));
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&AP.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_180);
    QPDFObjectHandle::replaceDict
              ((QPDFObjectHandle *)&stack0xffffffffffffffd8,(QPDFObjectHandle *)local_d8);
    QPDFAnnotationObjectHelper::getAppearanceDictionary
              ((QPDFAnnotationObjectHelper *)(local_1c8 + 0x10));
    bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)(local_1c8 + 0x10));
    if (bVar1) {
      QTC::TC("qpdf","QPDFFormFieldObjectHelper create AP from scratch",0);
      QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)local_1c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,"/AP",(allocator<char> *)(local_210 + 0x27));
      QPDFObjectHandle::newDictionary();
      QPDFObjectHandle::replaceKey
                ((QPDFObjectHandle *)local_1c8,&local_1e8,(QPDFObjectHandle *)(local_210 + 0x10));
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_210 + 0x10));
      std::__cxx11::string::~string((string *)&local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)(local_210 + 0x27));
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1c8);
      QPDFAnnotationObjectHelper::getAppearanceDictionary((QPDFAnnotationObjectHelper *)local_210);
      QPDFObjectHandle::operator=
                ((QPDFObjectHandle *)(local_1c8 + 0x10),(QPDFObjectHandle *)local_210);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_210);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"/N",(allocator<char> *)(local_248 + 0x17));
    QPDFObjectHandle::replaceKey
              ((QPDFObjectHandle *)(local_1c8 + 0x10),&local_230,
               (QPDFObjectHandle *)&stack0xffffffffffffffd8);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator((allocator<char> *)(local_248 + 0x17));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_1c8 + 0x10));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_d8);
  }
  bVar1 = QPDFObjectHandle::isStream((QPDFObjectHandle *)&stack0xffffffffffffffd8);
  if (bVar1) {
    QPDFObjectHandle::getDict((QPDFObjectHandle *)local_290);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_2b0,"/BBox",(allocator<char> *)(local_2c8 + 0x17));
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_290 + 0x10),(string *)local_290);
    std::__cxx11::string::~string(local_2b0);
    std::allocator<char>::~allocator((allocator<char> *)(local_2c8 + 0x17));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_290);
    bVar1 = QPDFObjectHandle::isRectangle((QPDFObjectHandle *)(local_290 + 0x10));
    if (bVar1) {
      QPDFObjectHandle::getArrayAsRectangle
                ((Rectangle *)((long)&DA.field_2 + 8),(QPDFObjectHandle *)(local_290 + 0x10));
      getDefaultAppearance_abi_cxx11_((string *)((long)&V.field_2 + 8),this);
      getValueAsString_abi_cxx11_
                ((string *)
                 &opt.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,this);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_368);
      bVar1 = isChoice(this);
      if ((bVar1) && (uVar2 = getFlags(this), (uVar2 & 0x20000) == 0)) {
        getChoices_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&tff.DA.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,this);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_368,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&tff.DA.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&tff.DA.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      anon_unknown.dwarf_1ed5f1::TfFinder::TfFinder((TfFinder *)&tok.m);
      Pl_QPDFTokenizer::Pl_QPDFTokenizer
                ((Pl_QPDFTokenizer *)&tf,"tf",(TokenFilter *)&tok.m,(Pipeline *)0x0);
      Pipeline::writeString((Pipeline *)&tf,(string *)((long)&V.field_2 + 8));
      Pl_QPDFTokenizer::finish((Pl_QPDFTokenizer *)&tf);
      local_448 = anon_unknown.dwarf_1ed5f1::TfFinder::getTf((TfFinder *)&tok.m);
      (anonymous_namespace)::TfFinder::getDA_abi_cxx11_((string *)&encoder,&tok.m);
      std::__cxx11::string::operator=((string *)(V.field_2._M_local_buf + 8),(string *)&encoder);
      std::__cxx11::string::~string((string *)&encoder);
      font_name.field_2._8_8_ = QUtil::utf8_to_ascii;
      (anonymous_namespace)::TfFinder::getFontName_abi_cxx11_
                ((string *)
                 &resources.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,&tok.m);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        QPDFObjectHandle::getDict((QPDFObjectHandle *)local_4b0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_4d0,"/Resources",
                   (allocator<char> *)
                   ((long)&font.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
        QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_4b0 + 0x10),(string *)local_4b0);
        std::__cxx11::string::~string(local_4d0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&font.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_4b0);
        QPDFObjectHandle::QPDFObjectHandle
                  ((QPDFObjectHandle *)&stack0xfffffffffffffb08,
                   (QPDFObjectHandle *)(local_4b0 + 0x10));
        getFontFromResource((QPDFFormFieldObjectHelper *)local_4e8,(QPDFObjectHandle *)this,
                            (string *)&stack0xfffffffffffffb08);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xfffffffffffffb08);
        dr.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._7_1_ = 0;
        bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)local_4e8);
        if (!bVar1) {
          getDefaultResources((QPDFFormFieldObjectHelper *)local_510);
          QPDFObjectHandle::QPDFObjectHandle
                    ((QPDFObjectHandle *)local_530,(QPDFObjectHandle *)local_510);
          getFontFromResource((QPDFFormFieldObjectHelper *)(local_530 + 0x10),
                              (QPDFObjectHandle *)this,(string *)local_530);
          QPDFObjectHandle::operator=
                    ((QPDFObjectHandle *)local_4e8,(QPDFObjectHandle *)(local_530 + 0x10));
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_530 + 0x10));
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_530);
          dr.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._7_1_ = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_4e8);
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_510);
        }
        if (((dr.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._7_1_ & 1) != 0) &&
           (bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_4b0 + 0x10)), bVar1))
        {
          QTC::TC("qpdf","QPDFFormFieldObjectHelper get font from /DR",0);
          bVar1 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)(local_4b0 + 0x10));
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_560,"",&local_561);
            oh = (QPDFObjectHandle *)
                 QPDFObjectHandle::getQPDF((QPDFObjectHandle *)(local_4b0 + 0x10),&local_560);
            QPDFObjectHandle::shallowCopy(&local_578);
            QPDF::makeIndirectObject((QPDF *)&local_540,oh);
            QPDFObjectHandle::operator=((QPDFObjectHandle *)(local_4b0 + 0x10),&local_540);
            QPDFObjectHandle::~QPDFObjectHandle(&local_540);
            QPDFObjectHandle::~QPDFObjectHandle(&local_578);
            std::__cxx11::string::~string((string *)&local_560);
            std::allocator<char>::~allocator(&local_561);
            QPDFObjectHandle::getDict(&local_588);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_5a8,"/Resources",&local_5a9);
            QPDFObjectHandle::replaceKey
                      (&local_588,&local_5a8,(QPDFObjectHandle *)(local_4b0 + 0x10));
            std::__cxx11::string::~string((string *)&local_5a8);
            std::allocator<char>::~allocator(&local_5a9);
            QPDFObjectHandle::~QPDFObjectHandle(&local_588);
          }
          operator____qpdf((char *)&local_5c0,0x414197);
          QPDFObjectHandle::mergeResources
                    ((QPDFObjectHandle *)(local_4b0 + 0x10),&local_5c0,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                      *)0x0);
          QPDFObjectHandle::~QPDFObjectHandle(&local_5c0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_5f0,"/Font",&local_5f1);
          QPDFObjectHandle::getKey(&local_5d0,(string *)(local_4b0 + 0x10));
          QPDFObjectHandle::replaceKey
                    (&local_5d0,
                     (string *)
                     &resources.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (QPDFObjectHandle *)local_4e8);
          QPDFObjectHandle::~QPDFObjectHandle(&local_5d0);
          std::__cxx11::string::~string(local_5f0);
          std::allocator<char>::~allocator(&local_5f1);
        }
        encoding.field_2._M_local_buf[0xe] = '\0';
        encoding.field_2._M_local_buf[0xd] = '\0';
        encoding.field_2._M_local_buf[0xc] = '\0';
        bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_4e8);
        local_80a = false;
        if (bVar1) {
          std::allocator<char>::allocator();
          encoding.field_2._M_local_buf[0xe] = '\x01';
          std::__cxx11::string::string<std::allocator<char>>
                    (local_628,"/Encoding",(allocator<char> *)(encoding.field_2._M_local_buf + 0xf))
          ;
          encoding.field_2._M_local_buf[0xd] = '\x01';
          QPDFObjectHandle::getKey(&local_608,(string *)local_4e8);
          encoding.field_2._M_local_buf[0xc] = '\x01';
          local_80a = QPDFObjectHandle::isName(&local_608);
        }
        if ((encoding.field_2._M_local_buf[0xc] & 1U) != 0) {
          QPDFObjectHandle::~QPDFObjectHandle(&local_608);
        }
        if ((encoding.field_2._M_local_buf[0xd] & 1U) != 0) {
          std::__cxx11::string::~string(local_628);
        }
        if ((encoding.field_2._M_local_buf[0xe] & 1U) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)(encoding.field_2._M_local_buf + 0xf))
          ;
        }
        if (local_80a != false) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_680,"/Encoding",&local_681);
          QPDFObjectHandle::getKey(&local_660,(string *)local_4e8);
          QPDFObjectHandle::getName_abi_cxx11_((string *)local_650,&local_660);
          QPDFObjectHandle::~QPDFObjectHandle(&local_660);
          std::__cxx11::string::~string(local_680);
          std::allocator<char>::~allocator(&local_681);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_650,"/WinAnsiEncoding");
          if (bVar1) {
            QTC::TC("qpdf","QPDFFormFieldObjectHelper WinAnsi",0);
            font_name.field_2._8_8_ = QUtil::utf8_to_win_ansi;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_650,"/MacRomanEncoding");
            if (bVar1) {
              font_name.field_2._8_8_ = QUtil::utf8_to_mac_roman;
            }
          }
          std::__cxx11::string::~string((string *)local_650);
        }
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_4e8);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_4b0 + 0x10));
      }
      (*(code *)font_name.field_2._8_8_)
                (&i,&opt.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,0x3f);
      std::__cxx11::string::operator=
                ((string *)
                 &opt.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&i);
      std::__cxx11::string::~string((string *)&i);
      for (local_6b0 = 0; uVar3 = local_6b0,
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_368), uVar3 < sVar4; local_6b0 = local_6b0 + 1) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_368,local_6b0);
        (*(code *)font_name.field_2._8_8_)(local_6d0,pvVar5,0x3f);
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_368,local_6b0);
        std::__cxx11::string::operator=((string *)pvVar5,local_6d0);
        std::__cxx11::string::~string(local_6d0);
      }
      this_00 = (ValueSetter *)operator_new(0x98);
      anon_unknown.dwarf_1ed5f1::ValueSetter::ValueSetter
                (this_00,(string *)((long)&V.field_2 + 8),
                 (string *)
                 &opt.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_368,local_448,(Rectangle *)((long)&DA.field_2 + 8));
      std::shared_ptr<QPDFObjectHandle::TokenFilter>::
      shared_ptr<(anonymous_namespace)::ValueSetter,void>(&local_6e0,this_00);
      QPDFObjectHandle::addTokenFilter((QPDFObjectHandle *)&stack0xffffffffffffffd8,&local_6e0);
      std::shared_ptr<QPDFObjectHandle::TokenFilter>::~shared_ptr(&local_6e0);
      std::__cxx11::string::~string
                ((string *)
                 &resources.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      Pl_QPDFTokenizer::~Pl_QPDFTokenizer((Pl_QPDFTokenizer *)&tf);
      anon_unknown.dwarf_1ed5f1::TfFinder::~TfFinder((TfFinder *)&tok.m);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_368);
      std::__cxx11::string::~string
                ((string *)
                 &opt.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)(V.field_2._M_local_buf + 8));
      bbox_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._0_4_ = 0;
    }
    else {
      QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)local_2c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e8,"unable to get appearance stream bounding box",
                 (allocator<char> *)((long)&bbox.ury + 7));
      QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_2c8,&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&bbox.ury + 7));
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_2c8);
      bbox_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._0_4_ = 1;
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_290 + 0x10));
  }
  else {
    QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)local_248);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,"unable to get normal appearance stream for update",
               (allocator<char> *)
               ((long)&bbox_obj.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_248,&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&bbox_obj.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_248);
    bbox_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._0_4_ = 1;
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void
QPDFFormFieldObjectHelper::generateTextAppearance(QPDFAnnotationObjectHelper& aoh)
{
    QPDFObjectHandle AS = aoh.getAppearanceStream("/N");
    if (AS.isNull()) {
        QTC::TC("qpdf", "QPDFFormFieldObjectHelper create AS from scratch");
        QPDFObjectHandle::Rectangle rect = aoh.getRect();
        QPDFObjectHandle::Rectangle bbox(0, 0, rect.urx - rect.llx, rect.ury - rect.lly);
        QPDFObjectHandle dict = QPDFObjectHandle::parse(
            "<< /Resources << /ProcSet [ /PDF /Text ] >> /Type /XObject /Subtype /Form >>");
        dict.replaceKey("/BBox", QPDFObjectHandle::newFromRectangle(bbox));
        AS = QPDFObjectHandle::newStream(oh().getOwningQPDF(), "/Tx BMC\nEMC\n");
        AS.replaceDict(dict);
        QPDFObjectHandle AP = aoh.getAppearanceDictionary();
        if (AP.isNull()) {
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper create AP from scratch");
            aoh.getObjectHandle().replaceKey("/AP", QPDFObjectHandle::newDictionary());
            AP = aoh.getAppearanceDictionary();
        }
        AP.replaceKey("/N", AS);
    }
    if (!AS.isStream()) {
        aoh.getObjectHandle().warnIfPossible("unable to get normal appearance stream for update");
        return;
    }
    QPDFObjectHandle bbox_obj = AS.getDict().getKey("/BBox");
    if (!bbox_obj.isRectangle()) {
        aoh.getObjectHandle().warnIfPossible("unable to get appearance stream bounding box");
        return;
    }
    QPDFObjectHandle::Rectangle bbox = bbox_obj.getArrayAsRectangle();
    std::string DA = getDefaultAppearance();
    std::string V = getValueAsString();
    std::vector<std::string> opt;
    if (isChoice() && ((getFlags() & ff_ch_combo) == 0)) {
        opt = getChoices();
    }

    TfFinder tff;
    Pl_QPDFTokenizer tok("tf", &tff);
    tok.writeString(DA);
    tok.finish();
    double tf = tff.getTf();
    DA = tff.getDA();

    std::string (*encoder)(std::string const&, char) = &QUtil::utf8_to_ascii;
    std::string font_name = tff.getFontName();
    if (!font_name.empty()) {
        // See if the font is encoded with something we know about.
        QPDFObjectHandle resources = AS.getDict().getKey("/Resources");
        QPDFObjectHandle font = getFontFromResource(resources, font_name);
        bool found_font_in_dr = false;
        if (!font) {
            QPDFObjectHandle dr = getDefaultResources();
            font = getFontFromResource(dr, font_name);
            found_font_in_dr = font.isDictionary();
        }
        if (found_font_in_dr && resources.isDictionary()) {
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper get font from /DR");
            if (resources.isIndirect()) {
                resources = resources.getQPDF().makeIndirectObject(resources.shallowCopy());
                AS.getDict().replaceKey("/Resources", resources);
            }
            // Use mergeResources to force /Font to be local
            resources.mergeResources("<< /Font << >> >>"_qpdf);
            resources.getKey("/Font").replaceKey(font_name, font);
        }

        if (font.isDictionary() && font.getKey("/Encoding").isName()) {
            std::string encoding = font.getKey("/Encoding").getName();
            if (encoding == "/WinAnsiEncoding") {
                QTC::TC("qpdf", "QPDFFormFieldObjectHelper WinAnsi");
                encoder = &QUtil::utf8_to_win_ansi;
            } else if (encoding == "/MacRomanEncoding") {
                encoder = &QUtil::utf8_to_mac_roman;
            }
        }
    }

    V = (*encoder)(V, '?');
    for (size_t i = 0; i < opt.size(); ++i) {
        opt.at(i) = (*encoder)(opt.at(i), '?');
    }

    AS.addTokenFilter(
        std::shared_ptr<QPDFObjectHandle::TokenFilter>(new ValueSetter(DA, V, opt, tf, bbox)));
}